

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool __thiscall tinyxml2::XMLElement::ShallowEqual(XMLElement *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  XMLAttribute *pXVar8;
  bool bVar9;
  bool bVar10;
  long *plVar2;
  
  iVar1 = (*compare->_vptr_XMLNode[6])(compare);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
LAB_001b1bf7:
    bVar9 = false;
  }
  else {
    lVar3 = (**(code **)(*plVar2 + 0x48))(plVar2);
    if (lVar3 == 0) {
      pcVar5 = StrPair::GetStr((StrPair *)(plVar2 + 3));
    }
    else {
      pcVar5 = (char *)0x0;
    }
    iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      pcVar4 = StrPair::GetStr(&(this->super_XMLNode)._value);
    }
    else {
      pcVar4 = (char *)0x0;
    }
    if (pcVar5 != pcVar4) {
      cVar7 = *pcVar5;
      if (cVar7 != '\0') {
        lVar3 = 0;
        do {
          if ((cVar7 != pcVar4[lVar3]) || ((int)lVar3 == 0x7fffffff)) {
            if ((int)lVar3 != 0x7fffffff) goto LAB_001b1bf7;
            goto LAB_001b1b65;
          }
          cVar7 = pcVar5[lVar3 + 1];
          lVar3 = lVar3 + 1;
        } while (cVar7 != '\0');
        if ((int)lVar3 == 0x7fffffff) goto LAB_001b1b65;
        pcVar4 = pcVar4 + lVar3;
      }
      if (*pcVar4 != '\0') goto LAB_001b1bf7;
    }
LAB_001b1b65:
    lVar3 = plVar2[0xc];
    pXVar8 = this->_rootAttribute;
    bVar9 = pXVar8 != (XMLAttribute *)0x0;
    bVar10 = lVar3 != 0;
    if (bVar10 && bVar9) {
      do {
        pcVar5 = StrPair::GetStr(&pXVar8->_value);
        pcVar4 = StrPair::GetStr((StrPair *)(lVar3 + 0x20));
        if (pcVar5 != pcVar4) {
          cVar7 = *pcVar5;
          if (cVar7 != '\0') {
            lVar6 = 0;
            do {
              if ((cVar7 != pcVar4[lVar6]) || ((int)lVar6 == 0x7fffffff)) {
                if ((int)lVar6 != 0x7fffffff) goto LAB_001b1bf7;
                goto LAB_001b1bd6;
              }
              cVar7 = pcVar5[lVar6 + 1];
              lVar6 = lVar6 + 1;
            } while (cVar7 != '\0');
            if ((int)lVar6 == 0x7fffffff) goto LAB_001b1bd6;
            pcVar4 = pcVar4 + lVar6;
          }
          if (*pcVar4 != '\0') goto LAB_001b1bf7;
        }
LAB_001b1bd6:
        lVar3 = *(long *)(lVar3 + 0x38);
        pXVar8 = pXVar8->_next;
        bVar9 = pXVar8 != (XMLAttribute *)0x0;
        bVar10 = lVar3 != 0;
      } while ((bVar10) && (pXVar8 != (XMLAttribute *)0x0));
    }
    bVar9 = (bool)((bVar9 | bVar10) ^ 1);
  }
  return bVar9;
}

Assistant:

bool XMLElement::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLElement* other = compare->ToElement();
    if ( other && XMLUtil::StringEqual( other->Name(), Name() )) {

        const XMLAttribute* a=FirstAttribute();
        const XMLAttribute* b=other->FirstAttribute();

        while ( a && b ) {
            if ( !XMLUtil::StringEqual( a->Value(), b->Value() ) ) {
                return false;
            }
            a = a->Next();
            b = b->Next();
        }
        if ( a || b ) {
            // different count
            return false;
        }
        return true;
    }
    return false;
}